

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  key_type kVar7;
  Type type;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  AssertionResult *assertion_result;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  char *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  allocator_type *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  Type in_stack_fffffffffffff9fc;
  hasher *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa10;
  undefined2 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa32;
  value_type in_stack_fffffffffffffa3c;
  uint i_00;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  string local_590 [48];
  key_type local_560;
  undefined1 local_559;
  AssertionResult local_558;
  string local_548 [48];
  key_type local_518;
  undefined1 local_511;
  AssertionResult local_510 [2];
  key_type local_4ec;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_4e8;
  Type local_4c4;
  AssertionResult local_4c0;
  string local_4b0 [48];
  key_type local_480;
  undefined1 local_479;
  AssertionResult local_478 [2];
  key_type local_454;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_450;
  value_type local_42c;
  AssertionResult local_428 [2];
  key_type local_404;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_400;
  value_type local_3dc;
  AssertionResult local_3d8;
  string local_3c8 [55];
  undefined1 local_391;
  AssertionResult local_390;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_380 [2];
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_358;
  string local_2d0 [55];
  undefined1 local_299;
  AssertionResult local_298;
  stringstream local_288 [392];
  key_type local_100;
  key_type local_fc;
  value_type local_d0;
  int local_cc;
  key_type local_c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8;
  undefined1 local_9c [156];
  
  bVar1 = google::
          HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_02 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_9c;
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    assertion_result = (AssertionResult *)(ulong)i_00;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b8,i_00,(int *)assertion_result)
    ;
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_c8 = kVar4;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    for (local_cc = 1; local_cc < 100; local_cc = local_cc + 1) {
      in_stack_fffffffffffffa3c =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      local_d0 = in_stack_fffffffffffffa3c;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(this_02,(value_type *)assertion_result);
    }
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_fc = kVar5;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9d0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_100 = kVar6;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9d0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::stringstream::stringstream(local_288);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      ((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)(local_9c + 0xc),local_288);
    local_299 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf9fc03);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa3c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffffa32,
                                                                in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_2d0);
      testing::Message::~Message((Message *)0xf9fcdf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9fd76);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_380,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_380);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      (&local_358,local_288);
    local_391 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xf9fe24);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa3c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_3c8);
      testing::Message::~Message((Message *)0xf9ff38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9ffcf);
    local_3dc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_404 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa10,
           (key_type *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_400);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      testing::AssertionResult::failure_message((AssertionResult *)0xfa00af);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xfa010c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa017d);
    local_42c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_454 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa10,
           (key_type *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_450);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa00);
      in_stack_fffffffffffffa10 =
           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xfa025d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xfa02ba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa032b);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_480 = kVar7;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_479 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xfa0393);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_478);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa3c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0,
                 in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_4b0);
      testing::Message::~Message((Message *)0xfa0468);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa04ff);
    type = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_4c4 = type;
    local_4ec = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa10,(key_type *)CONCAT44(kVar7,in_stack_fffffffffffffa08));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_4e8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               in_stack_fffffffffffff9e0,
               (int *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (int *)in_stack_fffffffffffff9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffff9f0 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0xfa05df);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 in_stack_fffffffffffff9e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      testing::Message::~Message((Message *)0xfa063c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa06ad);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    local_518 = kVar7;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff9d0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_511 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9d0,
               (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xfa0715);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_510);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa3c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,kVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9d0);
      std::__cxx11::string::~string(local_548);
      testing::Message::~Message((Message *)0xfa07ea);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa0881);
    local_560 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9d0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_559 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (type *)0xfa08e9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa3c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa30))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff9f0,kVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_590);
      testing::Message::~Message((Message *)0xfa09be);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa0a52);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xfa0a5f);
    std::__cxx11::stringstream::~stringstream(local_288);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xfa0a79);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}